

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

LBBox3fa * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx2::CurveGeometryInterface,_embree::BezierCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx2::CurveGeometryInterface,_embree::BezierCurveT>
               *this,size_t primID,BBox1f *time_range)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  int iVar5;
  size_t itime;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 auVar28 [16];
  float fVar32;
  undefined1 auVar30 [16];
  float fVar33;
  undefined1 auVar31 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  undefined1 local_e8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  size_t local_a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_108.primID = &local_a0;
  fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  fVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar7;
  fVar14 = (time_range->lower - fVar7) / fVar6;
  fVar6 = (time_range->upper - fVar7) / fVar6;
  fVar7 = fVar1 * fVar14;
  fVar9 = fVar1 * fVar6;
  auVar24 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
  auVar31 = vroundss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9),10);
  auVar28 = vmaxss_avx(auVar24,ZEXT816(0));
  auVar22 = vminss_avx(auVar31,ZEXT416((uint)fVar1));
  fVar8 = auVar28._0_4_;
  fVar18 = auVar22._0_4_;
  uVar4 = 0xffffffff;
  if (-1 < (int)auVar24._0_4_) {
    uVar4 = (int)auVar24._0_4_;
  }
  iVar5 = (int)fVar1 + 1;
  if ((int)auVar31._0_4_ < (int)fVar1 + 1) {
    iVar5 = (int)auVar31._0_4_;
  }
  local_108.this = this;
  local_a0 = primID;
  linearBounds::anon_class_16_2_07cfa4d6::operator()
            ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)fVar8);
  linearBounds::anon_class_16_2_07cfa4d6::operator()
            ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)fVar18);
  if (iVar5 - uVar4 == 1) {
    auVar28 = vmaxss_avx(ZEXT416((uint)(fVar7 - fVar8)),ZEXT816(0) << 0x40);
    fVar7 = auVar28._0_4_;
    fVar1 = 1.0 - fVar7;
    auVar26._0_4_ = fVar7 * local_f8.m128[0];
    auVar26._4_4_ = fVar7 * local_f8.m128[1];
    auVar26._8_4_ = fVar7 * local_f8.m128[2];
    auVar26._12_4_ = fVar7 * local_f8.m128[3];
    auVar19._4_4_ = fVar1;
    auVar19._0_4_ = fVar1;
    auVar19._8_4_ = fVar1;
    auVar19._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar26,auVar19,local_d8.m128);
    auVar10._0_4_ = fVar7 * local_e8._0_4_;
    auVar10._4_4_ = fVar7 * local_e8._4_4_;
    auVar10._8_4_ = fVar7 * local_e8._8_4_;
    auVar10._12_4_ = fVar7 * local_e8._12_4_;
    aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar10,local_c8,auVar19);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar3;
    auVar28 = vmaxss_avx(ZEXT416((uint)(fVar18 - fVar9)),ZEXT816(0) << 0x40);
    fVar7 = auVar28._0_4_;
    fVar1 = 1.0 - fVar7;
    auVar20._0_4_ = fVar7 * local_d8.m128[0];
    auVar20._4_4_ = fVar7 * local_d8.m128[1];
    auVar20._8_4_ = fVar7 * local_d8.m128[2];
    auVar20._12_4_ = fVar7 * local_d8.m128[3];
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar20,auVar15,local_f8.m128);
    auVar11._0_4_ = fVar7 * local_c8._0_4_;
    auVar11._4_4_ = fVar7 * local_c8._4_4_;
    auVar11._8_4_ = fVar7 * local_c8._8_4_;
    auVar11._12_4_ = fVar7 * local_c8._12_4_;
    aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar11,auVar15,local_e8);
    (__return_storage_ptr__->bounds1).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds1).upper.field_0 = aVar3;
  }
  else {
    linearBounds::anon_class_16_2_07cfa4d6::operator()
              ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)fVar8 + 1));
    linearBounds::anon_class_16_2_07cfa4d6::operator()
              ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)fVar18 + -1));
    auVar28 = vmaxss_avx(ZEXT416((uint)(fVar7 - fVar8)),ZEXT816(0) << 0x40);
    fVar8 = auVar28._0_4_;
    auVar21._0_4_ = fVar8 * local_58.m128[0];
    auVar21._4_4_ = fVar8 * local_58.m128[1];
    auVar21._8_4_ = fVar8 * local_58.m128[2];
    auVar21._12_4_ = fVar8 * local_58.m128[3];
    fVar7 = 1.0 - fVar8;
    auVar12._4_4_ = fVar7;
    auVar12._0_4_ = fVar7;
    auVar12._8_4_ = fVar7;
    auVar12._12_4_ = fVar7;
    auVar22 = vfmadd231ps_fma(auVar21,auVar12,(undefined1  [16])local_d8);
    auVar23._0_4_ = fVar8 * local_48;
    auVar23._4_4_ = fVar8 * fStack_44;
    auVar23._8_4_ = fVar8 * fStack_40;
    auVar23._12_4_ = fVar8 * fStack_3c;
    auVar24 = vfmadd231ps_fma(auVar23,auVar12,local_c8);
    auVar28 = vmaxss_avx(ZEXT416((uint)(fVar18 - fVar9)),ZEXT816(0) << 0x40);
    fVar9 = auVar28._0_4_;
    fVar7 = 1.0 - fVar9;
    auVar27._0_4_ = fVar9 * local_78.m128[0];
    auVar27._4_4_ = fVar9 * local_78.m128[1];
    auVar27._8_4_ = fVar9 * local_78.m128[2];
    auVar27._12_4_ = fVar9 * local_78.m128[3];
    auVar16._4_4_ = fVar7;
    auVar16._0_4_ = fVar7;
    auVar16._8_4_ = fVar7;
    auVar16._12_4_ = fVar7;
    auVar28 = vfmadd231ps_fma(auVar27,auVar16,(undefined1  [16])local_f8);
    auVar30._0_4_ = fVar9 * local_68;
    auVar30._4_4_ = fVar9 * fStack_64;
    auVar30._8_4_ = fVar9 * fStack_60;
    auVar30._12_4_ = fVar9 * fStack_5c;
    auVar31 = vfmadd231ps_fma(auVar30,auVar16,local_e8);
    if ((int)(uVar4 + 1) < iVar5) {
      itime = (size_t)(uVar4 + 1);
      iVar5 = ~uVar4 + iVar5;
      do {
        fVar9 = ((float)(int)itime / fVar1 - fVar14) / (fVar6 - fVar14);
        fVar7 = 1.0 - fVar9;
        auVar25._0_4_ = auVar28._0_4_ * fVar9;
        fVar18 = auVar28._4_4_;
        auVar25._4_4_ = fVar18 * fVar9;
        fVar8 = auVar28._8_4_;
        auVar25._8_4_ = fVar8 * fVar9;
        fVar29 = auVar28._12_4_;
        auVar25._12_4_ = fVar29 * fVar9;
        auVar17._4_4_ = fVar7;
        auVar17._0_4_ = fVar7;
        auVar17._8_4_ = fVar7;
        auVar17._12_4_ = fVar7;
        auVar12 = vfmadd231ps_fma(auVar25,auVar17,auVar22);
        auVar13._0_4_ = auVar31._0_4_ * fVar9;
        fVar7 = auVar31._4_4_;
        auVar13._4_4_ = fVar7 * fVar9;
        fVar32 = auVar31._8_4_;
        auVar13._8_4_ = fVar32 * fVar9;
        fVar33 = auVar31._12_4_;
        auVar13._12_4_ = fVar33 * fVar9;
        local_b8 = vfmadd231ps_fma(auVar13,auVar24,auVar17);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_98.field_1,&local_108,itime);
        local_138 = auVar24._0_4_;
        fStack_134 = auVar24._4_4_;
        fStack_130 = auVar24._8_4_;
        fStack_12c = auVar24._12_4_;
        local_128 = auVar22._0_4_;
        fStack_124 = auVar22._4_4_;
        fStack_120 = auVar22._8_4_;
        fStack_11c = auVar22._12_4_;
        auVar22 = vsubps_avx((undefined1  [16])local_98,auVar12);
        auVar12 = vsubps_avx(local_88,local_b8);
        auVar24 = vminps_avx(auVar22,ZEXT816(0) << 0x40);
        auVar12 = vmaxps_avx(auVar12,ZEXT816(0) << 0x40);
        auVar22._0_4_ = local_128 + auVar24._0_4_;
        auVar22._4_4_ = fStack_124 + auVar24._4_4_;
        auVar22._8_4_ = fStack_120 + auVar24._8_4_;
        auVar22._12_4_ = fStack_11c + auVar24._12_4_;
        auVar28._0_4_ = auVar28._0_4_ + auVar24._0_4_;
        auVar28._4_4_ = fVar18 + auVar24._4_4_;
        auVar28._8_4_ = fVar8 + auVar24._8_4_;
        auVar28._12_4_ = fVar29 + auVar24._12_4_;
        auVar24._0_4_ = local_138 + auVar12._0_4_;
        auVar24._4_4_ = fStack_134 + auVar12._4_4_;
        auVar24._8_4_ = fStack_130 + auVar12._8_4_;
        auVar24._12_4_ = fStack_12c + auVar12._12_4_;
        auVar31._0_4_ = auVar31._0_4_ + auVar12._0_4_;
        auVar31._4_4_ = fVar7 + auVar12._4_4_;
        auVar31._8_4_ = fVar32 + auVar12._8_4_;
        auVar31._12_4_ = fVar33 + auVar12._12_4_;
        itime = itime + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar22;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar24;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).lower.field_0.m128 = auVar28;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).upper.field_0.m128 = auVar31;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }